

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ClassesCollectConst1Group(Dch_Cla_t *p,Aig_Obj_t *pObj,int nNodes,Vec_Ptr_t *vRoots)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int Limit;
  int i;
  Vec_Ptr_t *vRoots_local;
  int nNodes_local;
  Aig_Obj_t *pObj_local;
  Dch_Cla_t *p_local;
  
  Vec_PtrClear(vRoots);
  iVar2 = pObj->Id;
  iVar1 = Aig_ManObjNumMax(p->pAig);
  iVar2 = Abc_MinInt(iVar2 + nNodes,iVar1);
  for (local_2c = pObj->Id; local_2c < iVar2; local_2c = local_2c + 1) {
    pObj_00 = Aig_ManObj(p->pAig,local_2c);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar1 = Dch_ObjIsConst1Cand(p->pAig,pObj_00);
      if (iVar1 != 0) {
        Vec_PtrPush(vRoots,pObj_00);
      }
    }
  }
  return;
}

Assistant:

void Dch_ClassesCollectConst1Group( Dch_Cla_t * p, Aig_Obj_t * pObj, int nNodes, Vec_Ptr_t * vRoots )
{
    int i, Limit;
    Vec_PtrClear( vRoots );
    Limit = Abc_MinInt( pObj->Id + nNodes, Aig_ManObjNumMax(p->pAig) );
    for ( i = pObj->Id; i < Limit; i++ )
    {
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj && Dch_ObjIsConst1Cand( p->pAig, pObj ) )
            Vec_PtrPush( vRoots, pObj );
    }
}